

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keyexpimp.c
# Opt level: O0

int magma_wrap_init(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  undefined4 *__s;
  undefined4 *in_RDX;
  void *in_RSI;
  undefined8 in_RDI;
  GOST_WRAP_CTX *cctx;
  
  __s = (undefined4 *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  memset(__s + 0x12,0,0x30);
  *(undefined8 *)(__s + 0x1e) = 0;
  if (in_RDX != (undefined4 *)0x0) {
    memset(__s,0,8);
    *__s = *in_RDX;
  }
  if (in_RSI != (void *)0x0) {
    memcpy(__s + 2,in_RSI,0x40);
  }
  return 1;
}

Assistant:

static int magma_wrap_init(EVP_CIPHER_CTX *ctx, const unsigned char *key,
	const unsigned char *iv, int enc)
{
	GOST_WRAP_CTX *cctx = EVP_CIPHER_CTX_get_cipher_data(ctx);
	memset(cctx->wrapped, 0, MAX_WRAPPED_KEY_LEN);
	cctx->wrap_count = 0;

	if (iv) {
		memset(cctx->iv, 0, 8);
		memcpy(cctx->iv, iv, 4);
	}

	if (key) {
		memcpy(cctx->key, key, GOSTKEYLEN*2);
	}
	return 1;
}